

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  bool bVar1;
  Slice *input_00;
  undefined8 *in_RDX;
  string *in_RSI;
  Slice *in_RDI;
  InternalKey key;
  Slice str;
  FileMetaData f;
  uint64_t number;
  int level;
  uint32_t tag;
  char *msg;
  Slice input;
  Status *result;
  value_type *in_stack_fffffffffffffdf8;
  VersionEdit *in_stack_fffffffffffffe00;
  Slice *in_stack_fffffffffffffe08;
  Slice *in_stack_fffffffffffffe10;
  uint7 in_stack_fffffffffffffe20;
  undefined1 uVar2;
  Slice *input_01;
  string local_e8 [64];
  Slice local_a8 [7];
  int local_34;
  char *local_30;
  Slice local_28;
  undefined8 *local_18;
  
  input_01 = in_RDI;
  local_18 = in_RDX;
  Clear(in_stack_fffffffffffffe00);
  local_28.data_ = (char *)*local_18;
  local_28.size_ = local_18[1];
  local_30 = (char *)0x0;
  FileMetaData::FileMetaData((FileMetaData *)in_stack_fffffffffffffe00);
  Slice::Slice(local_a8);
  InternalKey::InternalKey((InternalKey *)0x109d80);
  while( true ) {
    uVar2 = false;
    if (local_30 == (char *)0x0) {
      uVar2 = GetVarint32(input_01,(uint32_t *)(ulong)in_stack_fffffffffffffe20);
    }
    if ((bool)uVar2 == false) break;
    input_00 = (Slice *)(ulong)(local_34 - 1);
    switch(input_00) {
    case (Slice *)0x0:
      bVar1 = GetLengthPrefixedSlice(input_00,in_stack_fffffffffffffe10);
      if (bVar1) {
        Slice::ToString_abi_cxx11_(input_00);
        std::__cxx11::string::operator=(in_RSI,local_e8);
        std::__cxx11::string::~string(local_e8);
        in_RSI[0x40] = (string)0x1;
      }
      else {
        local_30 = "comparator name";
      }
      break;
    case (Slice *)0x1:
      bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
      if (bVar1) {
        in_RSI[0x41] = (string)0x1;
      }
      else {
        local_30 = "log number";
      }
      break;
    case (Slice *)0x2:
      bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
      if (bVar1) {
        in_RSI[0x43] = (string)0x1;
      }
      else {
        local_30 = "next file number";
      }
      break;
    case (Slice *)0x3:
      bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
      if (bVar1) {
        in_RSI[0x44] = (string)0x1;
      }
      else {
        local_30 = "last sequence number";
      }
      break;
    case (Slice *)0x4:
      bVar1 = GetLevel(in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
      if ((bVar1) &&
         (bVar1 = GetInternalKey(in_stack_fffffffffffffe08,(InternalKey *)in_stack_fffffffffffffe00)
         , bVar1)) {
        in_stack_fffffffffffffe10 = (Slice *)(in_RSI + 0x48);
        std::make_pair<int&,leveldb::InternalKey&>
                  ((int *)in_stack_fffffffffffffe08,(InternalKey *)in_stack_fffffffffffffe00);
        std::
        vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ::push_back((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                     *)in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
        std::pair<int,_leveldb::InternalKey>::~pair((pair<int,_leveldb::InternalKey> *)0x109fbf);
      }
      else {
        local_30 = "compaction pointer";
      }
      break;
    case (Slice *)0x5:
      bVar1 = GetLevel(in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
      if ((bVar1) &&
         (bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20)), bVar1
         )) {
        in_stack_fffffffffffffe08 = (Slice *)(in_RSI + 0x60);
        std::make_pair<int&,unsigned_long&>
                  ((int *)in_stack_fffffffffffffe00,(unsigned_long *)in_stack_fffffffffffffdf8);
        std::
        set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
        ::insert((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                  *)CONCAT17(uVar2,in_stack_fffffffffffffe20),(value_type *)input_00);
      }
      else {
        local_30 = "deleted file";
      }
      break;
    case (Slice *)0x6:
      bVar1 = GetLevel(in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
      if ((((bVar1) &&
           (bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20)),
           bVar1)) &&
          (bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20)),
          bVar1)) &&
         ((bVar1 = GetInternalKey(in_stack_fffffffffffffe08,(InternalKey *)in_stack_fffffffffffffe00
                                 ), bVar1 &&
          (bVar1 = GetInternalKey(in_stack_fffffffffffffe08,(InternalKey *)in_stack_fffffffffffffe00
                                 ), bVar1)))) {
        in_stack_fffffffffffffe00 = (VersionEdit *)(in_RSI + 0x90);
        std::make_pair<int&,leveldb::FileMetaData&>
                  ((int *)in_stack_fffffffffffffe08,(FileMetaData *)in_stack_fffffffffffffe00);
        std::
        vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
        ::push_back((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        std::pair<int,_leveldb::FileMetaData>::~pair((pair<int,_leveldb::FileMetaData> *)0x10a157);
      }
      else {
        local_30 = "new-file entry";
      }
      break;
    default:
      local_30 = "unknown tag";
      break;
    case (Slice *)0x8:
      bVar1 = GetVarint64(input_01,(uint64_t *)CONCAT17(uVar2,in_stack_fffffffffffffe20));
      if (bVar1) {
        in_RSI[0x42] = (string)0x1;
      }
      else {
        local_30 = "previous log number";
      }
    }
  }
  if ((local_30 == (char *)0x0) && (bVar1 = Slice::empty(&local_28), !bVar1)) {
    local_30 = "invalid tag";
  }
  Status::Status((Status *)input_01);
  if (local_30 != (char *)0x0) {
    Slice::Slice((Slice *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
    Slice::Slice((Slice *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
    Status::Corruption(in_stack_fffffffffffffe08,(Slice *)in_stack_fffffffffffffe00);
    Status::operator=((Status *)in_stack_fffffffffffffe00,(Status *)in_stack_fffffffffffffdf8);
    Status::~Status((Status *)in_stack_fffffffffffffe00);
  }
  InternalKey::~InternalKey((InternalKey *)0x10a236);
  FileMetaData::~FileMetaData((FileMetaData *)in_stack_fffffffffffffe00);
  return (Status)(char *)in_RDI;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}